

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O2

void P_StartLinkedSectorInterpolations
               (TArray<DInterpolation_*,_DInterpolation_*> *list,sector_t_conflict *sector,
               bool ceiling)

{
  extsector_t *peVar1;
  DInterpolation *in_RAX;
  long lVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  uint i;
  ulong uVar5;
  long lVar6;
  DInterpolation *local_38;
  
  peVar1 = sector->e;
  uVar4 = (ulong)(uint)((int)CONCAT71(in_register_00000011,ceiling) << 4);
  lVar6 = 0;
  local_38 = in_RAX;
  for (uVar5 = 0; uVar5 < *(uint *)((long)&(peVar1->Linked).Floor.Sectors.Count + uVar4);
      uVar5 = uVar5 + 1) {
    lVar2 = *(long *)((long)&(peVar1->Linked).Floor.Sectors.Array + uVar4);
    uVar3 = *(uint *)(lVar2 + 8 + lVar6);
    if ((uVar3 & 1) != 0) {
      local_38 = sector_t::SetInterpolation(*(sector_t **)(lVar2 + lVar6),1,false);
      TArray<DInterpolation_*,_DInterpolation_*>::Push(list,&local_38);
      lVar2 = *(long *)((long)&(peVar1->Linked).Floor.Sectors.Array + uVar4);
      uVar3 = *(uint *)(lVar2 + 8 + lVar6);
    }
    if ((uVar3 & 2) != 0) {
      local_38 = sector_t::SetInterpolation(*(sector_t **)(lVar2 + lVar6),0,false);
      TArray<DInterpolation_*,_DInterpolation_*>::Push(list,&local_38);
    }
    lVar6 = lVar6 + 0x10;
  }
  return;
}

Assistant:

void P_StartLinkedSectorInterpolations(TArray<DInterpolation *> &list, sector_t *sector, bool ceiling)
{
	extsector_t::linked::plane &scrollplane = ceiling? sector->e->Linked.Ceiling : sector->e->Linked.Floor;

	for(unsigned i = 0; i < scrollplane.Sectors.Size(); i++)
	{
		if (scrollplane.Sectors[i].Type & LINK_FLOOR)
		{
			list.Push(scrollplane.Sectors[i].Sector->SetInterpolation(sector_t::FloorMove, false));
		}
		if (scrollplane.Sectors[i].Type & LINK_CEILING)
		{
			list.Push(scrollplane.Sectors[i].Sector->SetInterpolation(sector_t::CeilingMove, false));
		}
	}
}